

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O3

void __thiscall llvm::Twine::print(Twine *this,raw_ostream *OS)

{
  Twine *this_00;
  
  this_00 = this;
  printOneChild(this,OS,this->LHS,this->LHSKind);
  printOneChild(this_00,OS,this->RHS,this->RHSKind);
  return;
}

Assistant:

void Twine::print(raw_ostream &OS) const {
  printOneChild(OS, LHS, getLHSKind());
  printOneChild(OS, RHS, getRHSKind());
}